

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

void doinsert(parse *p,sop op,size_t opnd,sopno pos)

{
  long lVar1;
  sop sVar2;
  int local_3c;
  int i;
  sop s;
  sopno sn;
  sopno pos_local;
  size_t opnd_local;
  sop op_local;
  parse *p_local;
  
  if (p->error == 0) {
    lVar1 = p->slen;
    doemit(p,op,opnd);
    sVar2 = p->strip[lVar1];
    for (local_3c = 1; local_3c < 10; local_3c = local_3c + 1) {
      if (pos <= p->pbegin[local_3c]) {
        p->pbegin[local_3c] = p->pbegin[local_3c] + 1;
      }
      if (pos <= p->pend[local_3c]) {
        p->pend[local_3c] = p->pend[local_3c] + 1;
      }
    }
    memmove(p->strip + pos + 1,p->strip + pos,((p->slen - pos) + -1) * 8);
    p->strip[pos] = sVar2;
  }
  return;
}

Assistant:

static void
doinsert(p, op, opnd, pos)
register struct parse *p;
sop op;
size_t opnd;
sopno pos;
{
	register sopno sn;
	register sop s;
	register int i;

	/* avoid making error situations worse */
	if (p->error != 0)
		return;

	sn = HERE();
	EMIT(op, opnd);		/* do checks, ensure space */
	assert(HERE() == sn+1);
	s = p->strip[sn];

	/* adjust paren pointers */
	assert(pos > 0);
	for (i = 1; i < NPAREN; i++) {
		if (p->pbegin[i] >= pos) {
			p->pbegin[i]++;
		}
		if (p->pend[i] >= pos) {
			p->pend[i]++;
		}
	}

	memmove((char *)&p->strip[pos+1], (char *)&p->strip[pos],
						(HERE()-pos-1)*sizeof(sop));
	p->strip[pos] = s;
}